

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O0

int OPENSSL_timegm(tm *tm,time_t *out)

{
  int iVar1;
  int64_t local_28;
  int64_t posix_time;
  time_t *out_local;
  tm *tm_local;
  
  posix_time = (int64_t)out;
  out_local = (time_t *)tm;
  iVar1 = OPENSSL_tm_to_posix(tm,&local_28);
  if (iVar1 != 0) {
    *(int64_t *)posix_time = local_28;
  }
  tm_local._4_4_ = (uint)(iVar1 != 0);
  return tm_local._4_4_;
}

Assistant:

int OPENSSL_timegm(const struct tm *tm, time_t *out) {
  static_assert(
      sizeof(time_t) == sizeof(int32_t) || sizeof(time_t) == sizeof(int64_t),
      "time_t is broken");
  int64_t posix_time;
  if (!OPENSSL_tm_to_posix(tm, &posix_time)) {
    return 0;
  }
  if (sizeof(time_t) == sizeof(int32_t) &&
      (posix_time > INT32_MAX || posix_time < INT32_MIN)) {
    return 0;
  }
  *out = (time_t)posix_time;
  return 1;
}